

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O1

string * __thiscall
font2svg::glyph::typography_box_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *this_00;
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this_00 = &this->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n\n  <!-- draw bearing + advance box --> ",0x28);
  iVar3 = (int)(this->gm).height + (int)(this->gm).vertBearingY;
  iVar1 = (int)(this->gm).horiAdvance;
  iVar4 = (int)(this->gm).vertAdvance - iVar3;
  iVar3 = -iVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\n <path stroke=\'blue\' fill=\'none\' stroke-dasharray=\'10,16\' d=\'",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," M",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)this_00,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," M",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," L",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," L",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," L",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," \'/>",4);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string typography_box()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw bearing + advance box --> ";
		int x1 = 0;
		int x2 = gm.horiAdvance;
		int y1 = -gm.vertBearingY-gm.height;
		int y2 = y1 + gm.vertAdvance;
		tmp << "\n <path stroke='blue' fill='none' stroke-dasharray='10,16' d='"
			<< " M" << x1 << "," << y1
			<< " M" << x1 << "," << y2
			<< " L" << x2 << "," << y2
			<< " L" << x2 << "," << y1
			<< " L" << x1 << "," << y1
			<< " '/>";

		return tmp.str();
	}